

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O2

int archive_write_mtree_header(archive_write *a,archive_entry *entry)

{
  undefined8 *puVar1;
  size_t sVar2;
  int64_t iVar3;
  unsigned_long uVar4;
  time_t tVar5;
  dev_t dVar6;
  bool bVar7;
  archive_string *dest;
  mode_t mVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  la_int64_t lVar12;
  mtree_entry_conflict *pmVar13;
  archive_entry *entry_00;
  time_t t;
  char *pcVar14;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *pcVar15;
  char *pcVar16;
  ulong uVar17;
  char *n;
  mtree_entry_conflict *pmVar18;
  mtree_entry_conflict *me;
  mtree_entry_conflict *local_170;
  archive_string local_168;
  char *local_150;
  archive_string *local_148;
  mtree_entry_conflict *local_140;
  char name [256];
  
  puVar1 = (undefined8 *)a->format_data;
  if (*(int *)(puVar1 + 0xe) != 0) {
    *(undefined4 *)(puVar1 + 0xe) = 0;
    archive_strcat((archive_string *)(puVar1 + 0xb),"#mtree\n");
    if ((*(uint *)(puVar1 + 0x24) & 0x380238) == 0) {
      *(undefined4 *)((long)puVar1 + 300) = 0;
    }
  }
  lVar12 = archive_entry_size(entry);
  puVar1[0xf] = lVar12;
  if ((*(int *)((long)puVar1 + 0x124) != 0) &&
     (mVar8 = archive_entry_filetype(entry), mVar8 != 0x4000)) {
    return 0;
  }
  iVar9 = mtree_entry_new(a,entry,&local_170);
  me = local_170;
  if (iVar9 < -0x14) {
    return iVar9;
  }
  pcVar14 = (char *)a->format_data;
  sVar2 = (local_170->parentdir).length;
  if (sVar2 == 0) {
    if (((local_170->basename).length != 1) || (*(local_170->basename).s != '.')) {
      pcVar14 = (local_170->pathname).s;
      pcVar16 = "Internal programing error in generating canonical name for %s";
      goto LAB_004c9029;
    }
    local_170->parent = local_170;
    pmVar13 = *(mtree_entry_conflict **)(pcVar14 + 8);
    if (pmVar13 == (mtree_entry_conflict *)0x0) {
      *(mtree_entry_conflict **)(pcVar14 + 8) = local_170;
      local_170->next = (mtree_entry_conflict *)0x0;
      **(undefined8 **)(pcVar14 + 0x38) = local_170;
      *(mtree_entry_conflict ***)(pcVar14 + 0x38) = &local_170->next;
      goto LAB_004c9156;
    }
  }
  else {
    pcVar16 = (local_170->parentdir).s;
    pcVar15 = extraout_RDX;
    if ((*(size_t *)(pcVar14 + 0x20) != sVar2) ||
       (iVar10 = strcmp(((archive_string *)(pcVar14 + 0x18))->s,pcVar16), pcVar15 = extraout_RDX_00,
       iVar10 != 0)) {
      n = pcVar16;
      pmVar18 = *(mtree_entry_conflict **)(pcVar14 + 8);
      local_148 = (archive_string *)(pcVar14 + 0x18);
LAB_004c8c23:
      uVar11 = get_path_component(name,(size_t)n,pcVar15);
      pcVar15 = pcVar16;
      if (uVar11 != 0) {
        if ((int)uVar11 < 0) {
          iVar10 = -0x1e;
          archive_set_error(&a->archive,-1,"A name buffer is too small");
          goto LAB_004c9039;
        }
        uVar17 = (ulong)uVar11;
        if (((uVar11 == 1) && (name[0] == '.')) && (pmVar18 != (mtree_entry_conflict *)0x0)) {
          if (pmVar18 == *(mtree_entry_conflict **)(pcVar14 + 8)) {
            pcVar15 = extraout_RDX_01;
            if (n[1] == '/') {
              n = n + 2;
            }
            else {
              n = n + 1;
            }
            goto LAB_004c8c23;
          }
        }
        else if (pmVar18 == (mtree_entry_conflict *)0x0) {
          pmVar18 = (mtree_entry_conflict *)0x0;
          goto LAB_004c8d1b;
        }
        pmVar13 = (mtree_entry_conflict *)
                  __archive_rb_tree_find_node(&pmVar18->dir_info->rbtree,name);
        if (pmVar13 == (mtree_entry_conflict *)0x0) goto LAB_004c8d1b;
        if (*n == '\0') goto LAB_004c900b;
        if (pmVar13->dir_info == (dir_info *)0x0) {
          archive_set_error(&a->archive,-1,"`%s\' is not directory, we cannot insert `%s\' ",
                            (pmVar13->pathname).s,(me->pathname).s);
          goto LAB_004c9036;
        }
        pcVar15 = n + (n[uVar17] == '/') + uVar17;
        n = pcVar15;
        pmVar18 = pmVar13;
        goto LAB_004c8c23;
      }
      uVar17 = 0;
LAB_004c8d1b:
      do {
        local_150 = pcVar15;
        dest = local_148;
        if (*n == '\0') goto LAB_004c8ef6;
        local_168.s = (char *)0x0;
        local_168.length = 0;
        local_168.buffer_length = 0;
        archive_strncat(&local_168,pcVar16,(size_t)(n + (uVar17 - (long)pcVar16)));
        pcVar16 = local_168.s;
        if (local_168.s[local_168.length - 1] == '/') {
          local_168.s[local_168.length - 1] = '\0';
          local_168.length = local_168.length - 1;
        }
        entry_00 = archive_entry_new();
        if (entry_00 == (archive_entry *)0x0) {
LAB_004c8dd7:
          archive_set_error(&a->archive,0xc,"Can\'t allocate memory");
          bVar7 = true;
          iVar10 = -0x1e;
          pmVar13 = (mtree_entry_conflict *)0x0;
        }
        else {
          archive_entry_copy_pathname(entry_00,pcVar16);
          archive_entry_set_mode(entry_00,0x41ed);
          t = time((time_t *)0x0);
          archive_entry_set_mtime(entry_00,t,0);
          iVar10 = mtree_entry_new(a,entry_00,&local_140);
          archive_entry_free(entry_00);
          if (iVar10 < -0x14) goto LAB_004c8dd7;
          local_140->dir_info->virtual = 1;
          bVar7 = false;
          iVar10 = 0;
          pmVar13 = local_140;
        }
        archive_string_free(&local_168);
        if (bVar7) goto LAB_004c9039;
        pcVar16 = (pmVar13->pathname).s;
        if ((*pcVar16 == '.') && (pcVar16[1] == '\0')) {
          *(mtree_entry_conflict **)(pcVar14 + 8) = pmVar13;
          pmVar18 = pmVar13;
        }
        else {
          __archive_rb_tree_insert_node(&pmVar18->dir_info->rbtree,&pmVar13->rbnode);
        }
        pcVar16 = local_150;
        pmVar13->parent = pmVar18;
        pmVar13->next = (mtree_entry_conflict *)0x0;
        **(undefined8 **)(pcVar14 + 0x38) = pmVar13;
        *(mtree_entry_conflict ***)(pcVar14 + 0x38) = &pmVar13->next;
        n = n + (n[uVar17] == '/') + uVar17;
        uVar11 = get_path_component(name,(size_t)n,pcVar14);
        if ((int)uVar11 < 0) {
          archive_string_free(&local_168);
          archive_set_error(&a->archive,-1,"A name buffer is too small");
          iVar10 = -0x1e;
          goto LAB_004c9039;
        }
        uVar17 = (ulong)uVar11;
        pmVar18 = pmVar13;
        pcVar15 = local_150;
      } while( true );
    }
    iVar10 = __archive_rb_tree_insert_node
                       (*(archive_rb_tree **)(*(long *)(pcVar14 + 0x10) + 0x28),&me->rbnode);
    if (iVar10 != 0) {
      me->parent = *(mtree_entry_conflict **)(pcVar14 + 0x10);
      me->next = (mtree_entry_conflict *)0x0;
      **(undefined8 **)(pcVar14 + 0x38) = me;
      *(mtree_entry_conflict ***)(pcVar14 + 0x38) = &me->next;
      goto LAB_004c9156;
    }
    pmVar13 = (mtree_entry_conflict *)
              __archive_rb_tree_find_node
                        (&(*(mtree_entry_conflict **)(pcVar14 + 0x10))->dir_info->rbtree,
                         (me->basename).s);
  }
LAB_004c900b:
  if (((me->mode ^ pmVar13->mode) & 0xf000) != 0) {
    pcVar14 = (pmVar13->pathname).s;
    pcVar16 = "Found duplicate entries `%s\' and its file type is different";
LAB_004c9029:
    archive_set_error(&a->archive,-1,pcVar16,pcVar14);
LAB_004c9036:
    iVar10 = -0x19;
LAB_004c9039:
    mtree_entry_free(local_170);
    return iVar10;
  }
  (pmVar13->symlink).length = 0;
  archive_string_concat(&pmVar13->symlink,&me->symlink);
  (pmVar13->uname).length = 0;
  archive_string_concat(&pmVar13->uname,&me->uname);
  (pmVar13->gname).length = 0;
  archive_string_concat(&pmVar13->gname,&me->gname);
  (pmVar13->fflags_text).length = 0;
  archive_string_concat(&pmVar13->fflags_text,&me->fflags_text);
  mVar8 = me->filetype;
  pmVar13->nlink = me->nlink;
  pmVar13->filetype = mVar8;
  pmVar13->mode = me->mode;
  iVar3 = me->uid;
  pmVar13->size = me->size;
  pmVar13->uid = iVar3;
  uVar4 = me->fflags_clear;
  pmVar13->fflags_set = me->fflags_set;
  pmVar13->fflags_clear = uVar4;
  tVar5 = me->mtime;
  pmVar13->gid = me->gid;
  pmVar13->mtime = tVar5;
  pmVar13->mtime_nsec = me->mtime_nsec;
  dVar6 = me->rdevminor;
  pmVar13->rdevmajor = me->rdevmajor;
  pmVar13->rdevminor = dVar6;
  dVar6 = me->devminor;
  pmVar13->devmajor = me->devmajor;
  pmVar13->devminor = dVar6;
  pmVar13->ino = me->ino;
  if (pmVar13->dir_info != (dir_info *)0x0) {
    pmVar13->dir_info->virtual = 0;
  }
  mtree_entry_free(me);
  me = pmVar13;
LAB_004c9156:
  *puVar1 = me;
  if (me->reg_info != (reg_info *)0x0) {
    *(undefined4 *)(puVar1 + 0x1c) = 0;
    uVar11 = *(uint *)(puVar1 + 0x24);
    if ((uVar11 & 1) != 0) {
      puVar1[0x1c] = 1;
      puVar1[0x1d] = 0;
    }
    if ((uVar11 >> 8 & 1) != 0) {
      iVar10 = __archive_openssl_md5init((archive_md5_ctx *)(puVar1 + 0x1e));
      if (iVar10 == 0) {
        *(byte *)((long)puVar1 + 0xe1) = *(byte *)((long)puVar1 + 0xe1) | 1;
        uVar11 = *(uint *)(puVar1 + 0x24);
      }
      else {
        uVar11 = *(uint *)(puVar1 + 0x24) & 0xfffffeff;
        *(uint *)(puVar1 + 0x24) = uVar11;
      }
    }
    if ((uVar11 >> 0xd & 1) != 0) {
      iVar10 = __archive_openssl_ripemd160init((archive_rmd160_ctx *)(puVar1 + 0x1f));
      if (iVar10 == 0) {
        *(byte *)((long)puVar1 + 0xe1) = *(byte *)((long)puVar1 + 0xe1) | 0x20;
        uVar11 = *(uint *)(puVar1 + 0x24);
      }
      else {
        uVar11 = *(uint *)(puVar1 + 0x24) & 0xffffdfff;
        *(uint *)(puVar1 + 0x24) = uVar11;
      }
    }
    if ((uVar11 >> 0xe & 1) != 0) {
      iVar10 = __archive_openssl_sha1init((archive_sha1_ctx *)(puVar1 + 0x20));
      if (iVar10 == 0) {
        *(byte *)((long)puVar1 + 0xe1) = *(byte *)((long)puVar1 + 0xe1) | 0x40;
        uVar11 = *(uint *)(puVar1 + 0x24);
      }
      else {
        uVar11 = *(uint *)(puVar1 + 0x24) & 0xffffbfff;
        *(uint *)(puVar1 + 0x24) = uVar11;
      }
    }
    if ((uVar11 >> 0x17 & 1) != 0) {
      iVar10 = __archive_openssl_sha256init((archive_sha256_ctx *)(puVar1 + 0x21));
      if (iVar10 == 0) {
        *(byte *)((long)puVar1 + 0xe2) = *(byte *)((long)puVar1 + 0xe2) | 0x80;
        uVar11 = *(uint *)(puVar1 + 0x24);
      }
      else {
        uVar11 = *(uint *)(puVar1 + 0x24) & 0xff7fffff;
        *(uint *)(puVar1 + 0x24) = uVar11;
      }
    }
    if ((uVar11 >> 0x18 & 1) != 0) {
      iVar10 = __archive_openssl_sha384init((archive_sha384_ctx *)(puVar1 + 0x22));
      if (iVar10 == 0) {
        *(byte *)((long)puVar1 + 0xe3) = *(byte *)((long)puVar1 + 0xe3) | 1;
        uVar11 = *(uint *)(puVar1 + 0x24);
      }
      else {
        uVar11 = *(uint *)(puVar1 + 0x24) & 0xfeffffff;
        *(uint *)(puVar1 + 0x24) = uVar11;
      }
    }
    if ((uVar11 >> 0x19 & 1) != 0) {
      iVar10 = __archive_openssl_sha512init((archive_sha512_ctx *)(puVar1 + 0x23));
      if (iVar10 == 0) {
        *(byte *)((long)puVar1 + 0xe3) = *(byte *)((long)puVar1 + 0xe3) | 2;
      }
      else {
        *(byte *)((long)puVar1 + 0x123) = *(byte *)((long)puVar1 + 0x123) & 0xfd;
      }
    }
  }
  return iVar9;
LAB_004c8ef6:
  *(mtree_entry_conflict **)(pcVar14 + 0x10) = pmVar18;
  pcVar14[0x20] = '\0';
  pcVar14[0x21] = '\0';
  pcVar14[0x22] = '\0';
  pcVar14[0x23] = '\0';
  pcVar14[0x24] = '\0';
  pcVar14[0x25] = '\0';
  pcVar14[0x26] = '\0';
  pcVar14[0x27] = '\0';
  archive_string_ensure(local_148,(pmVar18->parentdir).length + (pmVar18->basename).length + 2);
  sVar2 = (pmVar18->parentdir).length;
  if ((pmVar18->basename).length + sVar2 == 0) {
    *dest->s = '\0';
  }
  else {
    if (sVar2 != 0) {
      pcVar14[0x20] = '\0';
      pcVar14[0x21] = '\0';
      pcVar14[0x22] = '\0';
      pcVar14[0x23] = '\0';
      pcVar14[0x24] = '\0';
      pcVar14[0x25] = '\0';
      pcVar14[0x26] = '\0';
      pcVar14[0x27] = '\0';
      archive_string_concat(dest,&pmVar18->parentdir);
      archive_strappend_char(dest,'/');
    }
    archive_string_concat(dest,&pmVar18->basename);
  }
  iVar10 = __archive_rb_tree_insert_node(&pmVar18->dir_info->rbtree,&me->rbnode);
  if (iVar10 != 0) {
    me->parent = pmVar18;
    me->next = (mtree_entry_conflict *)0x0;
    **(undefined8 **)(pcVar14 + 0x38) = me;
    *(mtree_entry_conflict ***)(pcVar14 + 0x38) = &me->next;
    me = local_170;
    goto LAB_004c9156;
  }
  pmVar13 = (mtree_entry_conflict *)
            __archive_rb_tree_find_node(&pmVar18->dir_info->rbtree,(me->basename).s);
  goto LAB_004c900b;
}

Assistant:

static int
archive_write_mtree_header(struct archive_write *a,
    struct archive_entry *entry)
{
	struct mtree_writer *mtree= a->format_data;
	struct mtree_entry *mtree_entry;
	int r, r2;

	if (mtree->first) {
		mtree->first = 0;
		archive_strcat(&mtree->buf, "#mtree\n");
		if ((mtree->keys & SET_KEYS) == 0)
			mtree->output_global_set = 0;/* Disabled. */
	}

	mtree->entry_bytes_remaining = archive_entry_size(entry);

	/* While directory only mode, we do not handle non directory files. */
	if (mtree->dironly && archive_entry_filetype(entry) != AE_IFDIR)
		return (ARCHIVE_OK);

	r2 = mtree_entry_new(a, entry, &mtree_entry);
	if (r2 < ARCHIVE_WARN)
		return (r2);
	r = mtree_entry_tree_add(a, &mtree_entry);
	if (r < ARCHIVE_WARN) {
		mtree_entry_free(mtree_entry);
		return (r);
	}
	mtree->mtree_entry = mtree_entry;

	/* If the current file is a regular file, we have to
	 * compute the sum of its content.
	 * Initialize a bunch of sum check context. */
	if (mtree_entry->reg_info)
		sum_init(mtree);

	return (r2);
}